

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O0

int s2pred::ExactCompareEdgeDirections(Vector3_xf *a0,Vector3_xf *a1,Vector3_xf *b0,Vector3_xf *b1)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  Vector3<ExactFloat> local_e0;
  Vector3<ExactFloat> local_b0;
  ExactFloat local_80;
  byte local_69;
  S2LogMessage local_68;
  S2LogMessageVoidify local_55 [20];
  byte local_41;
  S2LogMessage local_40;
  S2LogMessageVoidify local_29;
  Vector3_xf *local_28;
  Vector3_xf *b1_local;
  Vector3_xf *b0_local;
  Vector3_xf *a1_local;
  Vector3_xf *a0_local;
  
  local_28 = b1;
  b1_local = b0;
  b0_local = a1;
  a1_local = a0;
  bVar1 = ArePointsAntipodal(a0,a1);
  local_41 = 0;
  if (bVar1) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_40,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2predicates.cc"
               ,0x316,kFatal,(ostream *)&std::cerr);
    local_41 = 1;
    poVar3 = S2LogMessage::stream(&local_40);
    poVar3 = std::operator<<(poVar3,"Check failed: !ArePointsAntipodal(a0, a1) ");
    S2LogMessageVoidify::operator&(&local_29,poVar3);
  }
  if ((local_41 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_40);
  }
  bVar1 = ArePointsAntipodal(b1_local,local_28);
  local_69 = 0;
  if (bVar1) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_68,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2predicates.cc"
               ,0x317,kFatal,(ostream *)&std::cerr);
    local_69 = 1;
    poVar3 = S2LogMessage::stream(&local_68);
    poVar3 = std::operator<<(poVar3,"Check failed: !ArePointsAntipodal(b0, b1) ");
    S2LogMessageVoidify::operator&(local_55,poVar3);
  }
  if ((local_69 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_68);
  }
  Vector3<ExactFloat>::CrossProd(&local_b0,a1_local,b0_local);
  Vector3<ExactFloat>::CrossProd(&local_e0,b1_local,local_28);
  util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::DotProd
            ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_80,&local_b0);
  iVar2 = ExactFloat::sgn(&local_80);
  ExactFloat::~ExactFloat(&local_80);
  Vector3<ExactFloat>::~Vector3(&local_e0);
  Vector3<ExactFloat>::~Vector3(&local_b0);
  return iVar2;
}

Assistant:

int ExactCompareEdgeDirections(const Vector3_xf& a0, const Vector3_xf& a1,
                               const Vector3_xf& b0, const Vector3_xf& b1) {
  S2_DCHECK(!ArePointsAntipodal(a0, a1));
  S2_DCHECK(!ArePointsAntipodal(b0, b1));
  return a0.CrossProd(a1).DotProd(b0.CrossProd(b1)).sgn();
}